

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

void helicsEndpointAddSourceTarget(HelicsEndpoint end,char *targetEndpoint,HelicsError *err)

{
  Interface *this;
  undefined8 *puVar1;
  size_t sVar2;
  bool bVar3;
  string_view newTarget;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (end == (HelicsEndpoint)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001af3ee;
    }
    else {
      bVar3 = *(int *)((long)end + 0x20) == -0x4bac6b3e;
      puVar1 = (undefined8 *)0x0;
      if (bVar3) {
        puVar1 = (undefined8 *)end;
      }
      if (bVar3 || err == (HelicsError *)0x0) goto LAB_001af3f0;
    }
    err->error_code = -3;
    err->message = "The given endpoint does not point to a valid object";
  }
LAB_001af3ee:
  puVar1 = (undefined8 *)0x0;
LAB_001af3f0:
  if (puVar1 != (undefined8 *)0x0) {
    this = (Interface *)*puVar1;
    sVar2 = strlen(targetEndpoint);
    newTarget._M_str = targetEndpoint;
    newTarget._M_len = sVar2;
    helics::Interface::addSourceTarget(this,newTarget,UNKNOWN);
  }
  return;
}

Assistant:

void helicsEndpointAddSourceTarget(HelicsEndpoint end, const char* targetEndpoint, HelicsError* err)
{
    auto* endObj = verifyEndpoint(end, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->addSourceTarget(targetEndpoint);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}